

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O0

int __thiscall libwebvtt::Parser::Init(Parser *this)

{
  ulong uVar1;
  char *pcVar2;
  char c_1;
  string local_58 [8];
  string line;
  char local_31;
  char *pcStack_30;
  char c;
  char *p;
  undefined2 local_1f;
  undefined1 local_1d;
  undefined1 uStack_1c;
  char kId [7];
  int e;
  Parser *this_local;
  
  unique0x10000147 = this;
  _uStack_1c = ParseBOM(this);
  if (_uStack_1c < 0) {
    return _uStack_1c;
  }
  if (0 < _uStack_1c) {
    return -1;
  }
  stack0xffffffffffffffdd = 0x56424557;
  local_1f = 0x5454;
  local_1d = 0;
  for (pcStack_30 = (char *)((long)&p + 5); *pcStack_30 != '\0'; pcStack_30 = pcStack_30 + 1) {
    _uStack_1c = (**(this->super_LineReader).super_Reader._vptr_Reader)(this,&local_31);
    if (_uStack_1c < 0) {
      return _uStack_1c;
    }
    if (0 < _uStack_1c) {
      return -1;
    }
    if (local_31 != *pcStack_30) {
      return -1;
    }
  }
  std::__cxx11::string::string(local_58);
  _uStack_1c = LineReader::GetLine(&this->super_LineReader,(string *)local_58);
  this_local._4_4_ = _uStack_1c;
  if (-1 < _uStack_1c) {
    if (_uStack_1c < 1) {
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)local_58);
        if ((*pcVar2 != ' ') && (*pcVar2 != '\t')) {
          this_local._4_4_ = -1;
          goto LAB_00107915;
        }
      }
      _uStack_1c = LineReader::GetLine(&this->super_LineReader,(string *)local_58);
      this_local._4_4_ = _uStack_1c;
      if (-1 < _uStack_1c) {
        if (_uStack_1c < 1) {
          uVar1 = std::__cxx11::string::empty();
          if ((uVar1 & 1) == 0) {
            this_local._4_4_ = -1;
          }
          else {
            this_local._4_4_ = 0;
          }
        }
        else {
          this_local._4_4_ = 0;
        }
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
LAB_00107915:
  std::__cxx11::string::~string(local_58);
  return this_local._4_4_;
}

Assistant:

int Parser::Init() {
  int e = ParseBOM();

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return -1;

  // Parse "WEBVTT".  We read from the stream one character at-a-time, in
  // order to defend against non-WebVTT streams (e.g. binary files) that don't
  // happen to comprise lines of text demarcated with line terminators.

  const char kId[] = "WEBVTT";

  for (const char* p = kId; *p; ++p) {
    char c;
    e = GetChar(&c);

    if (e < 0)  // error
      return e;

    if (e > 0)  // EOF
      return -1;

    if (c != *p)
      return -1;
  }

  std::string line;

  e = GetLine(&line);

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return 0;  // weird but valid

  if (!line.empty()) {
    // Parse optional characters that follow "WEBVTT"

    const char c = line[0];

    if (c != kSPACE && c != kTAB)
      return -1;
  }

  // The WebVTT spec requires that the "WEBVTT" line
  // be followed by an empty line (to separate it from
  // first cue).

  e = GetLine(&line);

  if (e < 0)  // error
    return e;

  if (e > 0)  // EOF
    return 0;  // weird but we allow it

  if (!line.empty())
    return -1;

  return 0;  // success
}